

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boss.cpp
# Opt level: O1

istream * operator>>(istream *i,Boss *b)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  size_type *psVar3;
  string local_288;
  int n;
  int workDone1;
  int workToDo1;
  int salaryPerHour1;
  int hourWork1;
  string name1;
  string local_230;
  string id1;
  Employee e;
  Person p;
  Address a;
  
  name1._M_dataplus._M_p = (pointer)&name1.field_2;
  name1._M_string_length = 0;
  name1.field_2._M_local_buf[0] = '\0';
  id1._M_string_length = 0;
  id1.field_2._M_local_buf[0] = '\0';
  psVar2 = &e.super_Person.name._M_string_length;
  id1._M_dataplus._M_p = (pointer)&id1.field_2;
  e.super_Person._vptr_Person = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&e,"");
  psVar3 = &p.name._M_string_length;
  p._vptr_Person = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&p,"");
  paVar1 = &local_288.field_2;
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
  Address::Address(&a,(string *)&e,(string *)&p,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (p._vptr_Person != (_func_int **)psVar3) {
    operator_delete(p._vptr_Person,p.name._M_string_length + 1);
  }
  if (e.super_Person._vptr_Person != (_func_int **)psVar2) {
    operator_delete(e.super_Person._vptr_Person,e.super_Person.name._M_string_length + 1);
  }
  e.super_Person._vptr_Person = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&e,"");
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"92*sa11178","");
  Person::Person(&p,(string *)&e,&local_288,&a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (e.super_Person._vptr_Person != (_func_int **)psVar2) {
    operator_delete(e.super_Person._vptr_Person,e.super_Person.name._M_string_length + 1);
  }
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"92*sa11178","");
  Employee::Employee(&e,&local_288,&local_230,&a,1,1,1,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter name: ",0xc);
  std::operator>>(i,(string *)&name1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter id: ",10);
  std::operator>>(i,(string *)&id1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter address: ",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  operator>>(i,&a);
  Person::setName(&p,&name1);
  Person::setId(&p,&id1);
  Person::setAddress(&p,&a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter hour work: ",0x11)
  ;
  std::istream::operator>>((istream *)i,&hourWork1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter salary per hour: ",0x17);
  std::istream::operator>>((istream *)i,&salaryPerHour1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter work to do: ",0x12);
  std::istream::operator>>((istream *)i,&workToDo1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter work done: ",0x11)
  ;
  std::istream::operator>>((istream *)i,&workDone1);
  Employee::setSalaryPerHour(&e,salaryPerHour1);
  Employee::setHourWork(&e,hourWork1);
  Employee::setWorkDone(&e,workDone1);
  Employee::setWorkToDo(&e,workToDo1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter number of employee: ",0x1a);
  std::istream::operator>>((istream *)i,&n);
  b->numberOfEmployee = n;
  e.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e.super_Person.address.street._M_dataplus._M_p != &e.super_Person.address.street.field_2) {
    operator_delete(e.super_Person.address.street._M_dataplus._M_p,
                    e.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e.super_Person.address.city._M_dataplus._M_p != &e.super_Person.address.city.field_2) {
    operator_delete(e.super_Person.address.city._M_dataplus._M_p,
                    e.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e.super_Person.address.country._M_dataplus._M_p != &e.super_Person.address.country.field_2)
  {
    operator_delete(e.super_Person.address.country._M_dataplus._M_p,
                    e.super_Person.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e.super_Person.id._M_dataplus._M_p != &e.super_Person.id.field_2) {
    operator_delete(e.super_Person.id._M_dataplus._M_p,
                    e.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e.super_Person.name._M_dataplus._M_p != &e.super_Person.name.field_2) {
    operator_delete(e.super_Person.name._M_dataplus._M_p,
                    e.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  p._vptr_Person = (_func_int **)&PTR_validate_00121a50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p.address.street._M_dataplus._M_p != &p.address.street.field_2) {
    operator_delete(p.address.street._M_dataplus._M_p,
                    p.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p.address.city._M_dataplus._M_p != &p.address.city.field_2) {
    operator_delete(p.address.city._M_dataplus._M_p,p.address.city.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p.address.country._M_dataplus._M_p != &p.address.country.field_2) {
    operator_delete(p.address.country._M_dataplus._M_p,
                    p.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p.id._M_dataplus._M_p != &p.id.field_2) {
    operator_delete(p.id._M_dataplus._M_p,p.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p.name._M_dataplus._M_p != &p.name.field_2) {
    operator_delete(p.name._M_dataplus._M_p,p.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a.street._M_dataplus._M_p != &a.street.field_2) {
    operator_delete(a.street._M_dataplus._M_p,a.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a.city._M_dataplus._M_p != &a.city.field_2) {
    operator_delete(a.city._M_dataplus._M_p,a.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a.country._M_dataplus._M_p != &a.country.field_2) {
    operator_delete(a.country._M_dataplus._M_p,a.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)id1._M_dataplus._M_p != &id1.field_2) {
    operator_delete(id1._M_dataplus._M_p,
                    CONCAT71(id1.field_2._M_allocated_capacity._1_7_,id1.field_2._M_local_buf[0]) +
                    1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name1._M_dataplus._M_p != &name1.field_2) {
    operator_delete(name1._M_dataplus._M_p,
                    CONCAT71(name1.field_2._M_allocated_capacity._1_7_,name1.field_2._M_local_buf[0]
                            ) + 1);
  }
  return i;
}

Assistant:

std::istream &operator>>(istream &i, Boss &b) {

    int hourWork1, salaryPerHour1, workToDo1, workDone1;
    string name1, id1;
    int n;
    Address a("", "", "");
    Person p("", "92*sa11178", a);
    Employee e("", "92*sa11178", a, 1, 1, 1, 1);
    cout << "Enter name: ";
    i >> name1;
    cout << "Enter id: ";
    i >> id1;
    cout << "Enter address: " << endl;
    i >> a;
    p.setName(name1);
    p.setId(id1);
    p.setAddress(a);
    cout << "Enter hour work: ";
    i >> hourWork1;
    cout << "Enter salary per hour: ";
    i >> salaryPerHour1;
    cout << "Enter work to do: ";
    i >> workToDo1;
    cout << "Enter work done: ";
    i >> workDone1;
    e.setSalaryPerHour(salaryPerHour1);
    e.setHourWork(hourWork1);
    e.setWorkDone(workDone1);
    e.setWorkToDo(workToDo1);
    cout << "Enter number of employee: ";
    i >> n;
    b.setNumberOfEmployee(n);
    return i;

}